

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O2

void __thiscall
BamTools::Internal::BamToolsIndex::ReadReferenceEntry
          (BamToolsIndex *this,BtiReferenceEntry *refEntry)

{
  int iVar1;
  reference refSummary;
  BamException *this_00;
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  iVar1 = refEntry->ID;
  if ((-1 < (long)iVar1) &&
     (iVar1 < (int)((ulong)((long)(this->m_indexFileSummary).
                                  super__Vector_base<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->m_indexFileSummary).
                                 super__Vector_base<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4))) {
    refSummary = std::
                 vector<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
                 ::at(&this->m_indexFileSummary,(long)iVar1);
    ReadBlocks(this,refSummary,&refEntry->Blocks);
    return;
  }
  this_00 = (BamException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_38,"BamToolsIndex::ReadReferenceEntry",&local_59);
  std::__cxx11::string::string((string *)&local_58,"invalid reference requested",&local_5a);
  BamException::BamException(this_00,&local_38,&local_58);
  __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamToolsIndex::ReadReferenceEntry(BtiReferenceEntry& refEntry)
{

    // return false if refId not valid index in file summary structure
    if (refEntry.ID < 0 || refEntry.ID >= (int)m_indexFileSummary.size())
        throw BamException("BamToolsIndex::ReadReferenceEntry", "invalid reference requested");

    // use index summary to assist reading the reference's BTI blocks
    const BtiReferenceSummary& refSummary = m_indexFileSummary.at(refEntry.ID);
    ReadBlocks(refSummary, refEntry.Blocks);
}